

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectNoErrors
          (CommandLineInterfaceTester *this)

{
  size_t sVar1;
  pointer *__ptr;
  char *pcVar2;
  bool bVar3;
  const_iterator __begin2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  long local_e0;
  long local_d8 [2];
  char local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  AssertHelper local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  State local_90;
  undefined4 uStack_8c;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  DelimiterType local_70;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_98,"0","return_code_",(int *)&local_e8,&this->return_code_);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if ((undefined8 *)CONCAT44(uStack_8c,local_90) == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_8c,local_90);
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(local_b8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_8c,local_90) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_8c,local_90));
  }
  local_48.text_._M_str = (this->captured_stderr_)._M_dataplus._M_p;
  local_48.text_._M_len = (this->captured_stderr_)._M_string_length;
  aStack_80._8_8_ = &local_48;
  local_48.delimiter_.c_ = '\n';
  local_98 = (undefined1  [8])0x0;
  local_90 = kInitState;
  local_88 = 0;
  aStack_80._M_allocated_capacity = 0;
  local_70.c_ = '\n';
  if (local_48.text_._M_str == (pointer)0x0) {
    local_90 = kEndState;
    bVar3 = false;
    local_98 = (undefined1  [8])local_48.text_._M_len;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_98);
    bVar3 = local_90 != kEndState;
  }
  sVar1 = local_48.text_._M_len;
  if ((bVar3) || (local_98 != (undefined1  [8])local_48.text_._M_len)) {
    do {
      testing::HasSubstr<char[9]>(&local_68,(StringLike<char[9]> *)"warning:");
      local_e8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_68.impl_.substring_._M_dataplus._M_p,
                 local_68.impl_.substring_._M_dataplus._M_p +
                 local_68.impl_.substring_._M_string_length);
      local_b8[0].data_ = (AssertHelperData *)local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_e8._M_head_impl,local_e8._M_head_impl + local_e0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
        operator_delete(local_e8._M_head_impl,local_d8[0] + 1);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
      ::operator()(local_c8,(char *)local_b8,
                   (basic_string_view<char,_std::char_traits<char>_> *)0x116f9f3);
      if (local_b8[0].data_ != (AssertHelperData *)local_a8) {
        operator_delete(local_b8[0].data_,local_a8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.impl_.substring_._M_dataplus._M_p != &local_68.impl_.substring_.field_2) {
        operator_delete(local_68.impl_.substring_._M_dataplus._M_p,
                        local_68.impl_.substring_.field_2._M_allocated_capacity + 1);
      }
      if (local_c8[0] == '\0') {
        testing::Message::Message((Message *)&local_e8);
        pcVar2 = anon_var_dwarf_a22956 + 5;
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_c0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                   ,0x7e,pcVar2);
        testing::internal::AssertHelper::operator=(local_b8,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(local_b8);
        if (local_e8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e8._M_head_impl + 8))();
        }
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
      absl::lts_20250127::strings_internal::
      SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_98);
    } while ((local_90 != kEndState) || (local_98 != (undefined1  [8])sVar1));
  }
  return;
}

Assistant:

void CommandLineInterfaceTester::ExpectNoErrors() {
  EXPECT_EQ(0, return_code_);

  // Note: since warnings and errors are both simply printed to stderr, we
  // can't holistically distinguish them here; in practice we don't have
  // multiline warnings so just counting any line with 'warning:' in it
  // is sufficient to separate warnings and errors in practice.
  for (const auto& line :
       absl::StrSplit(captured_stderr_, '\n', absl::SkipEmpty())) {
    EXPECT_THAT(line, HasSubstr("warning:"));
  }
}